

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

bool AreCompatiblePointerTypes(PType *dest,PType *source,bool forcompare)

{
  PClass *this;
  PClass *ti;
  bool bVar1;
  
  bVar1 = DObject::IsKindOf((DObject *)dest,PPointer::RegistrationInfo.MyClass);
  if (((bVar1) &&
      (bVar1 = DObject::IsKindOf((DObject *)source,PPointer::RegistrationInfo.MyClass), bVar1)) &&
     ((forcompare ||
      (*(char *)&dest[1].super_PTypeBase.super_DObject.Class ==
       *(char *)&source[1].super_PTypeBase.super_DObject.Class)))) {
    if (source == dest) {
      return true;
    }
    bVar1 = DObject::IsKindOf((DObject *)source[1].super_PTypeBase.super_DObject._vptr_DObject,
                              PClass::RegistrationInfo.MyClass);
    if ((bVar1) &&
       (bVar1 = DObject::IsKindOf((DObject *)dest[1].super_PTypeBase.super_DObject._vptr_DObject,
                                  PClass::RegistrationInfo.MyClass), bVar1)) {
      this = (PClass *)source[1].super_PTypeBase.super_DObject._vptr_DObject;
      ti = (PClass *)dest[1].super_PTypeBase.super_DObject._vptr_DObject;
      if ((forcompare) && (bVar1 = PClass::IsAncestorOf(this,ti), bVar1)) {
        return true;
      }
      bVar1 = PClass::IsAncestorOf(ti,this);
      return bVar1;
    }
  }
  return false;
}

Assistant:

static bool AreCompatiblePointerTypes(PType *dest, PType *source, bool forcompare = false)
{
	if (dest->IsKindOf(RUNTIME_CLASS(PPointer)) && source->IsKindOf(RUNTIME_CLASS(PPointer)))
	{
		// Pointers to different types are only compatible if both point to an object and the source type is a child of the destination type.
		auto fromtype = static_cast<PPointer *>(source);
		auto totype = static_cast<PPointer *>(dest);
		if (fromtype == nullptr) return true;
		if (!forcompare && totype->IsConst != fromtype->IsConst) return false;
		if (fromtype == totype) return true;
		if (fromtype->PointedType->IsKindOf(RUNTIME_CLASS(PClass)) && totype->PointedType->IsKindOf(RUNTIME_CLASS(PClass)))
		{
			auto fromcls = static_cast<PClass *>(fromtype->PointedType);
			auto tocls = static_cast<PClass *>(totype->PointedType);
			if (forcompare && tocls->IsDescendantOf(fromcls)) return true;
			return (fromcls->IsDescendantOf(tocls));
		}
	}
	return false;
}